

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.cpp
# Opt level: O0

void __thiscall CBloomFilter::insert(CBloomFilter *this,COutPoint *outpoint)

{
  Span<const_unsigned_char> vKey;
  CBloomFilter *this_00;
  long in_FS_OFFSET;
  Span<unsigned_char> SVar1;
  DataStream stream;
  DataStream *in_stack_ffffffffffffff68;
  COutPoint *in_stack_ffffffffffffff70;
  DataStream *in_stack_ffffffffffffff78;
  uchar *puVar2;
  size_t in_stack_ffffffffffffff98;
  uchar local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28[0x10] = '\0';
  local_28[0x11] = '\0';
  local_28[0x12] = '\0';
  local_28[0x13] = '\0';
  local_28[0x14] = '\0';
  local_28[0x15] = '\0';
  local_28[0x16] = '\0';
  local_28[0x17] = '\0';
  local_28[0x18] = '\0';
  local_28[0x19] = '\0';
  local_28[0x1a] = '\0';
  local_28[0x1b] = '\0';
  local_28[0x1c] = '\0';
  local_28[0x1d] = '\0';
  local_28[0x1e] = '\0';
  local_28[0x1f] = '\0';
  local_28[0] = '\0';
  local_28[1] = '\0';
  local_28[2] = '\0';
  local_28[3] = '\0';
  local_28[4] = '\0';
  local_28[5] = '\0';
  local_28[6] = '\0';
  local_28[7] = '\0';
  local_28[8] = '\0';
  local_28[9] = '\0';
  local_28[10] = '\0';
  local_28[0xb] = '\0';
  local_28[0xc] = '\0';
  local_28[0xd] = '\0';
  local_28[0xe] = '\0';
  local_28[0xf] = '\0';
  puVar2 = local_28;
  DataStream::DataStream(in_stack_ffffffffffffff68);
  DataStream::operator<<(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  SVar1 = MakeUCharSpan<DataStream&>(in_stack_ffffffffffffff78);
  this_00 = (CBloomFilter *)SVar1.m_size;
  Span<const_unsigned_char>::Span<unsigned_char,_0>
            ((Span<const_unsigned_char> *)in_stack_ffffffffffffff68,(Span<unsigned_char> *)0x1911f49
            );
  vKey.m_size = in_stack_ffffffffffffff98;
  vKey.m_data = puVar2;
  insert(this_00,vKey);
  DataStream::~DataStream(in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CBloomFilter::insert(const COutPoint& outpoint)
{
    DataStream stream{};
    stream << outpoint;
    insert(MakeUCharSpan(stream));
}